

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O1

Fra_Lcr_t * Lcr_ManAlloc(Aig_Man_t *pAig)

{
  Fra_Lcr_t *__s;
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  size_t __size;
  
  __s = (Fra_Lcr_t *)malloc(0x88);
  memset(__s,0,0x88);
  __s->pAig = pAig;
  __size = (long)pAig->nObjs[2] << 2;
  piVar1 = (int *)malloc(__size);
  __s->pInToOutPart = piVar1;
  memset(piVar1,0,__size);
  piVar1 = (int *)malloc(__size);
  __s->pInToOutNum = piVar1;
  memset(piVar1,0,__size);
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  __s->vFraigs = pVVar2;
  return __s;
}

Assistant:

Fra_Lcr_t * Lcr_ManAlloc( Aig_Man_t * pAig )
{
    Fra_Lcr_t * p;
    p = ABC_ALLOC( Fra_Lcr_t, 1 );
    memset( p, 0, sizeof(Fra_Lcr_t) );
    p->pAig = pAig;
    p->pInToOutPart = ABC_ALLOC( int, Aig_ManCiNum(pAig) );
    memset( p->pInToOutPart, 0, sizeof(int) * Aig_ManCiNum(pAig) );
    p->pInToOutNum = ABC_ALLOC( int, Aig_ManCiNum(pAig) );
    memset( p->pInToOutNum, 0, sizeof(int) * Aig_ManCiNum(pAig) );
    p->vFraigs = Vec_PtrAlloc( 1000 );
    return p;
}